

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O2

void __thiscall
tst_SerialiserCommon::saveLoadByteArray
          (tst_SerialiserCommon *this,AbstractModelSerialiser *serialiser,
          QAbstractItemModel *sourceModel,QAbstractItemModel *destinationModel,bool multiRole,
          bool checkHeaders)

{
  bool bVar1;
  char cVar2;
  undefined7 in_register_00000081;
  QByteArray dataArray;
  QModelIndex local_60;
  QModelIndex local_48;
  
  AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
  if ((int)CONCAT71(in_register_00000081,multiRole) != 0) {
    (**(code **)(*(long *)serialiser + 0x70))(serialiser,0x101);
  }
  dataArray.d.d = (Data *)0x0;
  dataArray.d.ptr = (char *)0x0;
  dataArray.d.size = 0;
  bVar1 = (bool)(**(code **)(*(long *)serialiser + 0xa8))(serialiser);
  cVar2 = QTest::qVerify(bVar1,"serialiser->saveModel(&dataArray)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0xe);
  if (cVar2 != '\0') {
    AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
    bVar1 = (bool)(**(code **)(*(long *)serialiser + 0xb8))(serialiser,&dataArray);
    cVar2 = QTest::qVerify(bVar1,"serialiser->loadModel(dataArray)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                           ,0x10);
    if (cVar2 != '\0') {
      local_48.r = -1;
      local_48.c = -1;
      local_48.i = 0;
      local_48.m = (QAbstractItemModel *)0x0;
      local_60.r = -1;
      local_60.c = -1;
      local_60.i = 0;
      local_60.m = (QAbstractItemModel *)0x0;
      checkModelEqual(this,sourceModel,destinationModel,&local_48,&local_60,checkHeaders);
    }
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&dataArray.d);
  return;
}

Assistant:

void tst_SerialiserCommon::saveLoadByteArray(AbstractModelSerialiser *serialiser, const QAbstractItemModel *sourceModel,
                                             QAbstractItemModel *destinationModel, bool multiRole, bool checkHeaders) const
{
    serialiser->setModel(sourceModel);
    if (multiRole)
        serialiser->addRoleToSave(Qt::UserRole + 1);
    QByteArray dataArray;
    QVERIFY(serialiser->saveModel(&dataArray));
    serialiser->setModel(destinationModel);
    QVERIFY(serialiser->loadModel(dataArray));
    checkModelEqual(sourceModel, destinationModel, QModelIndex(), QModelIndex(), checkHeaders);
}